

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow_conflict *window;
  ImDrawData *pIVar6;
  ImGuiContext_conflict1 *pIVar7;
  ImGuiContext_conflict1 *pIVar8;
  ulong uVar9;
  ImDrawList *pIVar10;
  char *__function;
  float fVar11;
  ImGuiContext_conflict1 *g;
  float fVar12;
  int iVar13;
  int iVar14;
  ImDrawList **ppIVar15;
  ulong uVar16;
  int n;
  long lVar17;
  ImGuiWindow_conflict *pIVar18;
  long lVar19;
  ImGuiWindow_conflict *pIVar20;
  float scale;
  ImVec2 mouse_cursor_size;
  ImVec2 mouse_cursor_offset;
  ImGuiWindow_conflict *windows_to_render_top_most [2];
  ImVec2 mouse_cursor_uv [4];
  ImVec2 local_68;
  ImVec2 local_60;
  ImGuiWindow_conflict *local_58 [2];
  ImVec2 local_48;
  undefined8 uStack_40;
  ImVec2 local_38;
  undefined8 uStack_30;
  
  pIVar7 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1297,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar7->FrameCountRendered = pIVar7->FrameCount;
  (pIVar7->IO).MetricsRenderWindows = 0;
  if (0 < (pIVar7->Hooks).Size) {
    lVar17 = 0;
    lVar19 = 0;
    do {
      pIVar4 = (pIVar7->Hooks).Data;
      if (*(int *)((long)&pIVar4->Type + lVar17) == 4) {
        (**(code **)((long)&pIVar4->Callback + lVar17))(pIVar7);
      }
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar19 < (pIVar7->Hooks).Size);
  }
  uVar2 = (pIVar7->Viewports).Size;
  uVar9 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar16 = 0;
    do {
      if ((long)(int)uVar9 <= (long)uVar16) {
        __function = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
        goto LAB_00194d22;
      }
      pIVar5 = (pIVar7->Viewports).Data[uVar16];
      ImDrawDataBuilder::Clear(&pIVar5->DrawDataBuilder);
      if (pIVar5->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList((ImGuiViewportP_conflict1 *)pIVar5,0,"##Background");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar10);
      }
      uVar16 = uVar16 + 1;
      uVar9 = (ulong)(uint)(pIVar7->Viewports).Size;
    } while (uVar16 != uVar9);
  }
  pIVar20 = pIVar7->NavWindowingTarget;
  if ((pIVar20 == (ImGuiWindow_conflict *)0x0) || ((pIVar20->Flags & 0x2000) != 0)) {
    pIVar18 = (ImGuiWindow_conflict *)0x0;
  }
  else {
    pIVar18 = pIVar20->RootWindowDockTree;
  }
  local_58[0] = pIVar18;
  if (pIVar20 == (ImGuiWindow_conflict *)0x0) {
    pIVar20 = (ImGuiWindow_conflict *)0x0;
  }
  else {
    pIVar20 = pIVar7->NavWindowingListWindow;
  }
  local_58[1] = pIVar20;
  uVar2 = (pIVar7->Windows).Size;
  uVar9 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar16 = 0;
    do {
      if ((long)(int)uVar9 <= (long)uVar16) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_00194d22:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,__function);
      }
      window = (pIVar7->Windows).Data[uVar16];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar20 && window != pIVar18) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
      }
      uVar16 = uVar16 + 1;
      uVar9 = (ulong)(uint)(pIVar7->Windows).Size;
    } while (uVar16 != uVar9);
  }
  lVar17 = 0;
  do {
    pIVar20 = local_58[lVar17];
    if (((pIVar20 != (ImGuiWindow_conflict *)0x0) && (pIVar20->Active == true)) &&
       (pIVar20->Hidden == false)) {
      AddWindowToDrawData(pIVar20,(uint)pIVar20->Flags >> 0x19 & 1);
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 == 1);
  local_60.x = 0.0;
  local_60.y = 0.0;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_38.x = 0.0;
  local_38.y = 0.0;
  uStack_30 = 0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  uStack_40 = 0;
  if (((pIVar7->IO).MouseDrawCursor != false) && (pIVar7->MouseCursor != -1)) {
    ImFontAtlas::GetMouseCursorTexData
              ((pIVar7->IO).Fonts,pIVar7->MouseCursor,&local_60,&local_68,&local_48,&local_38);
  }
  (pIVar7->IO).MetricsRenderVertices = 0;
  (pIVar7->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar7->Viewports).Size) {
    lVar17 = 0;
    do {
      pIVar5 = (pIVar7->Viewports).Data[lVar17];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar5->DrawDataBuilder);
      if ((0.0 < local_68.x) && (0.0 < local_68.y)) {
        fVar12 = (pIVar5->super_ImGuiViewport).Pos.y;
        fVar11 = (pIVar7->IO).MousePos.y;
        if ((fVar11 < (pIVar5->super_ImGuiViewport).Size.y + fVar12) &&
           (scale = (pIVar7->Style).MouseCursorScale * (pIVar5->super_ImGuiViewport).DpiScale,
           fVar12 < (local_68.y + 2.0) * scale + fVar11)) {
          fVar12 = (pIVar5->super_ImGuiViewport).Pos.x;
          fVar11 = (pIVar7->IO).MousePos.x;
          if ((fVar11 < (pIVar5->super_ImGuiViewport).Size.x + fVar12) &&
             (fVar12 < (local_68.x + 2.0) * scale + fVar11)) {
            pIVar10 = GetViewportDrawList((ImGuiViewportP_conflict1 *)pIVar5,1,"##Foreground");
            RenderMouseCursor(pIVar10,(pIVar7->IO).MousePos,scale,pIVar7->MouseCursor,0xffffffff,
                              0xff000000,0x30000000);
          }
        }
      }
      if (pIVar5->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar10 = GetViewportDrawList((ImGuiViewportP_conflict1 *)pIVar5,1,"##Foreground");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar10);
      }
      pIVar8 = GImGui;
      if (GImGui == (ImGuiContext_conflict1 *)0x0) {
        __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0xdd6,"ImGuiIO &ImGui::GetIO()");
      }
      uVar2 = (pIVar5->super_ImGuiViewport).Flags;
      (pIVar5->super_ImGuiViewport).DrawData = &pIVar5->DrawDataP;
      (pIVar5->DrawDataP).Valid = true;
      iVar3 = (pIVar5->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar3 < 1) {
        ppIVar15 = (ImDrawList **)0x0;
      }
      else {
        ppIVar15 = (pIVar5->DrawDataBuilder).Layers[0].Data;
      }
      fVar11 = 0.0;
      (pIVar5->DrawDataP).CmdLists = ppIVar15;
      (pIVar5->DrawDataP).CmdListsCount = iVar3;
      (pIVar5->DrawDataP).TotalIdxCount = 0;
      (pIVar5->DrawDataP).TotalVtxCount = 0;
      (pIVar5->DrawDataP).DisplayPos = (pIVar5->super_ImGuiViewport).Pos;
      fVar12 = 0.0;
      if ((uVar2 >> 10 & 1) == 0) {
        fVar12 = (pIVar5->super_ImGuiViewport).Size.x;
        fVar11 = (pIVar5->super_ImGuiViewport).Size.y;
      }
      (pIVar5->DrawDataP).DisplaySize.x = fVar12;
      (pIVar5->DrawDataP).DisplaySize.y = fVar11;
      (pIVar5->DrawDataP).FramebufferScale = (pIVar8->IO).DisplayFramebufferScale;
      (pIVar5->DrawDataP).OwnerViewport = &pIVar5->super_ImGuiViewport;
      if (0 < iVar3) {
        lVar19 = 0;
        iVar13 = 0;
        iVar14 = 0;
        do {
          pIVar10 = (pIVar5->DrawDataBuilder).Layers[0].Data[lVar19];
          iVar14 = iVar14 + (pIVar10->VtxBuffer).Size;
          iVar13 = iVar13 + (pIVar10->IdxBuffer).Size;
          lVar19 = lVar19 + 1;
        } while (iVar3 != lVar19);
        (pIVar5->DrawDataP).TotalVtxCount = iVar14;
        (pIVar5->DrawDataP).TotalIdxCount = iVar13;
      }
      pIVar6 = (pIVar5->super_ImGuiViewport).DrawData;
      piVar1 = &(pIVar7->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + pIVar6->TotalVtxCount;
      piVar1 = &(pIVar7->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + pIVar6->TotalIdxCount;
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pIVar7->Viewports).Size);
  }
  if (0 < (pIVar7->Hooks).Size) {
    lVar17 = 0;
    lVar19 = 0;
    do {
      pIVar4 = (pIVar7->Hooks).Data;
      if (*(int *)((long)&pIVar4->Type + lVar17) == 5) {
        (**(code **)((long)&pIVar4->Callback + lVar17))(pIVar7,(long)&pIVar4->HookId + lVar17);
      }
      lVar19 = lVar19 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar19 < (pIVar7->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindowDockTree : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    ImVec2 mouse_cursor_offset, mouse_cursor_size, mouse_cursor_uv[4];
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
        g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &mouse_cursor_offset, &mouse_cursor_size, &mouse_cursor_uv[0], &mouse_cursor_uv[2]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        // (note we scale cursor by current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor)
        if (mouse_cursor_size.x > 0.0f && mouse_cursor_size.y > 0.0f)
        {
            float scale = g.Style.MouseCursorScale * viewport->DpiScale;
            if (viewport->GetMainRect().Overlaps(ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(mouse_cursor_size.x + 2, mouse_cursor_size.y + 2) * scale)))
                RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, scale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));
        }

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = viewport->DrawData;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}